

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

bool glcts::verifyImage<float,4u,3u,3u>(float *data,float *expected_values,GLuint n_layers)

{
  bool bVar1;
  uint local_2c;
  GLuint face;
  GLuint n_total_faces;
  GLuint n_layers_local;
  float *expected_values_local;
  float *data_local;
  
  local_2c = 0;
  while( true ) {
    if (n_layers * 6 <= local_2c) {
      return true;
    }
    bVar1 = verifyFace<float,4u,3u,3u>(data,local_2c,expected_values,n_layers * 0x12);
    if (!bVar1) break;
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

bool verifyImage(const T* data, const T* expected_values, const glw::GLuint n_layers)
{
	static const glw::GLuint n_faces = 6;

	const glw::GLuint n_total_faces = n_layers * n_faces;

	for (glw::GLuint face = 0; face < n_total_faces; ++face)
	{
		if (false == verifyFace<T, N_Components, Width, Height>(data, face, expected_values, n_total_faces * Width))
		{
			return false;
		}
	}

	return true;
}